

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LibMath.cpp
# Opt level: O2

void lib::math::RegisterLibMath(State *state)

{
  Library lib;
  TableMemberReg math [29];
  
  luna::Library::Library(&lib,state);
  math[0].name_ = "abs";
  math[0].field_1.func_ = Abs;
  math[0].type_ = ValueT_CFunction;
  math[1].name_ = "acos";
  math[1].field_1.func_ = Acos;
  math[2].name_ = "asin";
  math[2].field_1.func_ = Asin;
  math[3].name_ = "atan";
  math[3].field_1.func_ = Atan;
  math[4].name_ = "atan2";
  math[4].field_1.func_ = Atan2;
  math[5].name_ = "ceil";
  math[5].field_1.func_ = Ceil;
  math[6].name_ = "cos";
  math[6].field_1.func_ = Cos;
  math[7].name_ = "cosh";
  math[7].field_1.func_ = Cosh;
  math[8].name_ = "deg";
  math[8].field_1.func_ = Deg;
  math[9].name_ = "exp";
  math[9].field_1.func_ = Exp;
  math[10].name_ = "floor";
  math[10].field_1.func_ = Floor;
  math[0xb].name_ = "fmod";
  math[0xb].field_1.func_ = Fmod;
  math[0xc].name_ = "frexp";
  math[0xc].field_1.func_ = Frexp;
  math[0xd].name_ = "ldexp";
  math[0xd].field_1.func_ = Ldexp;
  math[0xe].name_ = "log";
  math[0xe].field_1.func_ = Log;
  math[0xf].name_ = "max";
  math[0xf].field_1.func_ = Max;
  math[0x10].name_ = "min";
  math[0x10].field_1.func_ = Min;
  math[0x11].name_ = "modf";
  math[0x11].field_1.func_ = Modf;
  math[0x12].name_ = "pow";
  math[0x12].field_1.func_ = Pow;
  math[0x13].name_ = "rad";
  math[0x13].field_1.func_ = Rad;
  math[0x14].name_ = "random";
  math[0x14].field_1.func_ = Random;
  math[0x15].name_ = "randomseed";
  math[0x15].field_1.func_ = RandomSeed;
  math[0x16].name_ = "sin";
  math[0x16].field_1.func_ = Sin;
  math[0x17].name_ = "sinh";
  math[0x17].field_1.func_ = Sinh;
  math[0x18].name_ = "sqrt";
  math[0x18].field_1.func_ = Sqrt;
  math[0x19].name_ = "tan";
  math[0x19].field_1.func_ = Tan;
  math[0x1a].name_ = "tanh";
  math[0x1a].field_1.func_ = Tanh;
  math[0x1b].name_ = "huge";
  math[0x1b].field_1.number_ = INFINITY;
  math[0x1b].type_ = ValueT_Number;
  math[0x1c].name_ = "pi";
  math[0x1c].field_1.func_ = (CFunctionType)0x400921fb54442d18;
  math[1].type_ = math[0].type_;
  math[2].type_ = math[0].type_;
  math[3].type_ = math[0].type_;
  math[4].type_ = math[0].type_;
  math[5].type_ = math[0].type_;
  math[6].type_ = math[0].type_;
  math[7].type_ = math[0].type_;
  math[8].type_ = math[0].type_;
  math[9].type_ = math[0].type_;
  math[10].type_ = math[0].type_;
  math[0xb].type_ = math[0].type_;
  math[0xc].type_ = math[0].type_;
  math[0xd].type_ = math[0].type_;
  math[0xe].type_ = math[0].type_;
  math[0xf].type_ = math[0].type_;
  math[0x10].type_ = math[0].type_;
  math[0x11].type_ = math[0].type_;
  math[0x12].type_ = math[0].type_;
  math[0x13].type_ = math[0].type_;
  math[0x14].type_ = math[0].type_;
  math[0x15].type_ = math[0].type_;
  math[0x16].type_ = math[0].type_;
  math[0x17].type_ = math[0].type_;
  math[0x18].type_ = math[0].type_;
  math[0x19].type_ = math[0].type_;
  math[0x1a].type_ = math[0].type_;
  math[0x1c].type_ = math[0x1b].type_;
  luna::Library::RegisterTableFunction<29ul>(&lib,"math",&math);
  return;
}

Assistant:

void RegisterLibMath(luna::State *state)
    {
        luna::Library lib(state);
        luna::TableMemberReg math[] = {
            { "abs", Abs },
            { "acos", Acos },
            { "asin", Asin },
            { "atan", Atan },
            { "atan2", Atan2 },
            { "ceil", Ceil },
            { "cos", Cos },
            { "cosh", Cosh },
            { "deg", Deg },
            { "exp", Exp },
            { "floor", Floor },
            { "fmod", Fmod },
            { "frexp", Frexp },
            { "ldexp", Ldexp },
            { "log", Log },
            { "max", Max },
            { "min", Min },
            { "modf", Modf },
            { "pow", Pow },
            { "rad", Rad },
            { "random", Random },
            { "randomseed", RandomSeed },
            { "sin", Sin },
            { "sinh", Sinh },
            { "sqrt", Sqrt },
            { "tan", Tan },
            { "tanh", Tanh },
            { "huge", HUGE_VAL },
            { "pi", M_PI }
        };

        lib.RegisterTableFunction("math", math);
    }